

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

char * idToString(PolicyID id)

{
  char *pcStack_10;
  PolicyID id_local;
  
  switch(id) {
  case CMP0000:
    pcStack_10 = "CMP0000";
    break;
  case CMP0001:
    pcStack_10 = "CMP0001";
    break;
  case CMP0002:
    pcStack_10 = "CMP0002";
    break;
  case CMP0003:
    pcStack_10 = "CMP0003";
    break;
  case CMP0004:
    pcStack_10 = "CMP0004";
    break;
  case CMP0005:
    pcStack_10 = "CMP0005";
    break;
  case CMP0006:
    pcStack_10 = "CMP0006";
    break;
  case CMP0007:
    pcStack_10 = "CMP0007";
    break;
  case CMP0008:
    pcStack_10 = "CMP0008";
    break;
  case CMP0009:
    pcStack_10 = "CMP0009";
    break;
  case CMP0010:
    pcStack_10 = "CMP0010";
    break;
  case CMP0011:
    pcStack_10 = "CMP0011";
    break;
  case CMP0012:
    pcStack_10 = "CMP0012";
    break;
  case CMP0013:
    pcStack_10 = "CMP0013";
    break;
  case CMP0014:
    pcStack_10 = "CMP0014";
    break;
  case CMP0015:
    pcStack_10 = "CMP0015";
    break;
  case CMP0016:
    pcStack_10 = "CMP0016";
    break;
  case CMP0017:
    pcStack_10 = "CMP0017";
    break;
  case CMP0018:
    pcStack_10 = "CMP0018";
    break;
  case CMP0019:
    pcStack_10 = "CMP0019";
    break;
  case CMP0020:
    pcStack_10 = "CMP0020";
    break;
  case CMP0021:
    pcStack_10 = "CMP0021";
    break;
  case CMP0022:
    pcStack_10 = "CMP0022";
    break;
  case CMP0023:
    pcStack_10 = "CMP0023";
    break;
  case CMP0024:
    pcStack_10 = "CMP0024";
    break;
  case CMP0025:
    pcStack_10 = "CMP0025";
    break;
  case CMP0026:
    pcStack_10 = "CMP0026";
    break;
  case CMP0027:
    pcStack_10 = "CMP0027";
    break;
  case CMP0028:
    pcStack_10 = "CMP0028";
    break;
  case CMP0029:
    pcStack_10 = "CMP0029";
    break;
  case CMP0030:
    pcStack_10 = "CMP0030";
    break;
  case CMP0031:
    pcStack_10 = "CMP0031";
    break;
  case CMP0032:
    pcStack_10 = "CMP0032";
    break;
  case CMP0033:
    pcStack_10 = "CMP0033";
    break;
  case CMP0034:
    pcStack_10 = "CMP0034";
    break;
  case CMP0035:
    pcStack_10 = "CMP0035";
    break;
  case CMP0036:
    pcStack_10 = "CMP0036";
    break;
  case CMP0037:
    pcStack_10 = "CMP0037";
    break;
  case CMP0038:
    pcStack_10 = "CMP0038";
    break;
  case CMP0039:
    pcStack_10 = "CMP0039";
    break;
  case CMP0040:
    pcStack_10 = "CMP0040";
    break;
  case CMP0041:
    pcStack_10 = "CMP0041";
    break;
  case CMP0042:
    pcStack_10 = "CMP0042";
    break;
  case CMP0043:
    pcStack_10 = "CMP0043";
    break;
  case CMP0044:
    pcStack_10 = "CMP0044";
    break;
  case CMP0045:
    pcStack_10 = "CMP0045";
    break;
  case CMP0046:
    pcStack_10 = "CMP0046";
    break;
  case CMP0047:
    pcStack_10 = "CMP0047";
    break;
  case CMP0048:
    pcStack_10 = "CMP0048";
    break;
  case CMP0049:
    pcStack_10 = "CMP0049";
    break;
  case CMP0050:
    pcStack_10 = "CMP0050";
    break;
  case CMP0051:
    pcStack_10 = "CMP0051";
    break;
  case CMP0052:
    pcStack_10 = "CMP0052";
    break;
  case CMP0053:
    pcStack_10 = "CMP0053";
    break;
  case CMP0054:
    pcStack_10 = "CMP0054";
    break;
  case CMP0055:
    pcStack_10 = "CMP0055";
    break;
  case CMP0056:
    pcStack_10 = "CMP0056";
    break;
  case CMP0057:
    pcStack_10 = "CMP0057";
    break;
  case CMP0058:
    pcStack_10 = "CMP0058";
    break;
  case CMP0059:
    pcStack_10 = "CMP0059";
    break;
  case CMP0060:
    pcStack_10 = "CMP0060";
    break;
  case CMP0061:
    pcStack_10 = "CMP0061";
    break;
  case CMP0062:
    pcStack_10 = "CMP0062";
    break;
  case CMP0063:
    pcStack_10 = "CMP0063";
    break;
  case CMP0064:
    pcStack_10 = "CMP0064";
    break;
  case CMP0065:
    pcStack_10 = "CMP0065";
    break;
  case CMP0066:
    pcStack_10 = "CMP0066";
    break;
  case CMP0067:
    pcStack_10 = "CMP0067";
    break;
  case CMP0068:
    pcStack_10 = "CMP0068";
    break;
  case CMP0069:
    pcStack_10 = "CMP0069";
    break;
  case CMP0070:
    pcStack_10 = "CMP0070";
    break;
  case CMP0071:
    pcStack_10 = "CMP0071";
    break;
  case CMP0072:
    pcStack_10 = "CMP0072";
    break;
  case CMP0073:
    pcStack_10 = "CMP0073";
    break;
  case CMP0074:
    pcStack_10 = "CMP0074";
    break;
  case CMP0075:
    pcStack_10 = "CMP0075";
    break;
  case CMP0076:
    pcStack_10 = "CMP0076";
    break;
  case CMP0077:
    pcStack_10 = "CMP0077";
    break;
  case CMP0078:
    pcStack_10 = "CMP0078";
    break;
  case CMP0079:
    pcStack_10 = "CMP0079";
    break;
  case CMP0080:
    pcStack_10 = "CMP0080";
    break;
  case CMP0081:
    pcStack_10 = "CMP0081";
    break;
  case CMP0082:
    pcStack_10 = "CMP0082";
    break;
  case CMP0083:
    pcStack_10 = "CMP0083";
    break;
  case CMP0084:
    pcStack_10 = "CMP0084";
    break;
  case CMP0085:
    pcStack_10 = "CMP0085";
    break;
  case CMP0086:
    pcStack_10 = "CMP0086";
    break;
  case CMP0087:
    pcStack_10 = "CMP0087";
    break;
  case CMP0088:
    pcStack_10 = "CMP0088";
    break;
  case CMP0089:
    pcStack_10 = "CMP0089";
    break;
  case CMP0090:
    pcStack_10 = "CMP0090";
    break;
  case CMP0091:
    pcStack_10 = "CMP0091";
    break;
  case CMP0092:
    pcStack_10 = "CMP0092";
    break;
  case CMP0093:
    pcStack_10 = "CMP0093";
    break;
  case CMP0094:
    pcStack_10 = "CMP0094";
    break;
  case CMP0095:
    pcStack_10 = "CMP0095";
    break;
  case CMP0096:
    pcStack_10 = "CMP0096";
    break;
  case CMP0097:
    pcStack_10 = "CMP0097";
    break;
  case CMP0098:
    pcStack_10 = "CMP0098";
    break;
  case CMP0099:
    pcStack_10 = "CMP0099";
    break;
  case CMP0100:
    pcStack_10 = "CMP0100";
    break;
  case CMP0101:
    pcStack_10 = "CMP0101";
    break;
  case CMP0102:
    pcStack_10 = "CMP0102";
    break;
  case CMP0103:
    pcStack_10 = "CMP0103";
    break;
  case CMP0104:
    pcStack_10 = "CMP0104";
    break;
  case CMP0105:
    pcStack_10 = "CMP0105";
    break;
  case CMP0106:
    pcStack_10 = "CMP0106";
    break;
  case CMP0107:
    pcStack_10 = "CMP0107";
    break;
  case CMP0108:
    pcStack_10 = "CMP0108";
    break;
  case CMP0109:
    pcStack_10 = "CMP0109";
    break;
  case CMP0110:
    pcStack_10 = "CMP0110";
    break;
  case CMP0111:
    pcStack_10 = "CMP0111";
    break;
  case CMP0112:
    pcStack_10 = "CMP0112";
    break;
  case CMP0113:
    pcStack_10 = "CMP0113";
    break;
  case CMP0114:
    pcStack_10 = "CMP0114";
    break;
  case CMP0115:
    pcStack_10 = "CMP0115";
    break;
  case CMP0116:
    pcStack_10 = "CMP0116";
    break;
  case CMP0117:
    pcStack_10 = "CMP0117";
    break;
  case CMP0118:
    pcStack_10 = "CMP0118";
    break;
  case CMP0119:
    pcStack_10 = "CMP0119";
    break;
  case CMP0120:
    pcStack_10 = "CMP0120";
    break;
  case CMP0121:
    pcStack_10 = "CMP0121";
    break;
  case CMP0122:
    pcStack_10 = "CMP0122";
    break;
  case CMP0123:
    pcStack_10 = "CMP0123";
    break;
  case CMP0124:
    pcStack_10 = "CMP0124";
    break;
  case CMP0125:
    pcStack_10 = "CMP0125";
    break;
  case CMP0126:
    pcStack_10 = "CMP0126";
    break;
  case CMP0127:
    pcStack_10 = "CMP0127";
    break;
  case CMP0128:
    pcStack_10 = "CMP0128";
    break;
  case CMP0129:
    pcStack_10 = "CMP0129";
    break;
  case CMP0130:
    pcStack_10 = "CMP0130";
    break;
  case CMP0131:
    pcStack_10 = "CMP0131";
    break;
  case CMP0132:
    pcStack_10 = "CMP0132";
    break;
  case CMP0133:
    pcStack_10 = "CMP0133";
    break;
  case CMP0134:
    pcStack_10 = "CMP0134";
    break;
  case CMP0135:
    pcStack_10 = "CMP0135";
    break;
  case CMP0136:
    pcStack_10 = "CMP0136";
    break;
  case CMP0137:
    pcStack_10 = "CMP0137";
    break;
  case CMP0138:
    pcStack_10 = "CMP0138";
    break;
  case CMP0139:
    pcStack_10 = "CMP0139";
    break;
  case CMP0140:
    pcStack_10 = "CMP0140";
    break;
  case CMP0141:
    pcStack_10 = "CMP0141";
    break;
  case CMP0142:
    pcStack_10 = "CMP0142";
    break;
  case CMP0143:
    pcStack_10 = "CMP0143";
    break;
  case CMP0144:
    pcStack_10 = "CMP0144";
    break;
  case CMP0145:
    pcStack_10 = "CMP0145";
    break;
  case CMP0146:
    pcStack_10 = "CMP0146";
    break;
  case CMP0147:
    pcStack_10 = "CMP0147";
    break;
  case CMP0148:
    pcStack_10 = "CMP0148";
    break;
  case CMP0149:
    pcStack_10 = "CMP0149";
    break;
  case CMP0150:
    pcStack_10 = "CMP0150";
    break;
  case CMP0151:
    pcStack_10 = "CMP0151";
    break;
  case CMP0152:
    pcStack_10 = "CMP0152";
    break;
  case CMP0153:
    pcStack_10 = "CMP0153";
    break;
  case CMP0154:
    pcStack_10 = "CMP0154";
    break;
  case CMP0155:
    pcStack_10 = "CMP0155";
    break;
  case CMP0156:
    pcStack_10 = "CMP0156";
    break;
  case CMP0157:
    pcStack_10 = "CMP0157";
    break;
  case CMP0158:
    pcStack_10 = "CMP0158";
    break;
  case CMP0159:
    pcStack_10 = "CMP0159";
    break;
  case CMP0160:
    pcStack_10 = "CMP0160";
    break;
  case CMP0161:
    pcStack_10 = "CMP0161";
    break;
  case CMP0162:
    pcStack_10 = "CMP0162";
    break;
  case CMP0163:
    pcStack_10 = "CMP0163";
    break;
  case CMPCOUNT:
    pcStack_10 = (char *)0x0;
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* idToString(cmPolicies::PolicyID id)
{
  switch (id) {
#define POLICY_CASE(ID)                                                       \
  case cmPolicies::ID:                                                        \
    return #ID;
    CM_FOR_EACH_POLICY_ID(POLICY_CASE)
#undef POLICY_CASE
    case cmPolicies::CMPCOUNT:
      return nullptr;
  }
  return nullptr;
}